

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortSuccessor
          (BytewiseComparatorImpl *this,string *key)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uStack_28;
  uint8_t byte;
  size_t i;
  size_t n;
  string *key_local;
  BytewiseComparatorImpl *this_local;
  
  uVar2 = std::__cxx11::string::size();
  uStack_28 = 0;
  while( true ) {
    if (uVar2 <= uStack_28) {
      return;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)key);
    cVar1 = *pcVar3;
    if (cVar1 != -1) break;
    uStack_28 = uStack_28 + 1;
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)key);
  *pcVar3 = cVar1 + '\x01';
  std::__cxx11::string::resize((ulong)key);
  return;
}

Assistant:

void FindShortSuccessor(std::string* key) const override {
    // Find first character that can be incremented
    size_t n = key->size();
    for (size_t i = 0; i < n; i++) {
      const uint8_t byte = (*key)[i];
      if (byte != static_cast<uint8_t>(0xff)) {
        (*key)[i] = byte + 1;
        key->resize(i + 1);
        return;
      }
    }
    // *key is a run of 0xffs.  Leave it alone.
  }